

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_number_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue val;
  int radix;
  double d;
  
  JVar7 = js_thisNumberValue(ctx,this_val);
  if ((int)JVar7.tag == 6) {
    JVar3.float64 = -NAN;
    JVar6 = JVar7.u;
LAB_001579cd:
    iVar5 = JVar7.tag;
    uVar4 = (ulong)JVar7.u.ptr & (ulong)JVar3.ptr;
  }
  else {
    iVar2 = 10;
    if ((magic == 0) && ((int)argv->tag != 3)) {
      val.tag = argv->tag;
      val.u.ptr = (argv->u).ptr;
      iVar2 = JS_ToInt32Sat(ctx,&radix,val);
      if (iVar2 == 0) {
        iVar2 = radix;
        if (0xffffffdc < radix - 0x25U) goto LAB_00157991;
        JS_ThrowRangeError(ctx,"radix must be between 2 and 36");
      }
      JS_FreeValue(ctx,JVar7);
    }
    else {
LAB_00157991:
      iVar1 = JS_ToFloat64Free(ctx,&d,JVar7);
      if (iVar1 == 0) {
        JVar7 = js_dtoa(ctx,d,iVar2,0,0);
        JVar3 = JVar7.u;
        JVar7.tag = JVar7.tag;
        JVar7.u.float64 = -NAN;
        JVar6 = JVar3;
        goto LAB_001579cd;
      }
    }
    iVar5 = 6;
    JVar6.float64 = 0.0;
    uVar4 = 0;
  }
  JVar8.u.ptr = (void *)((ulong)JVar6.ptr & 0xffffffff | uVar4);
  JVar8.tag = iVar5;
  return JVar8;
}

Assistant:

static JSValue js_number_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue val;
    int base;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (magic || JS_IsUndefined(argv[0])) {
        base = 10;
    } else {
        base = js_get_radix(ctx, argv[0]);
        if (base < 0)
            goto fail;
    }
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    return js_dtoa(ctx, d, base, 0, JS_DTOA_VAR_FORMAT);
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}